

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

void __thiscall
testing::internal::ParameterizedTestFactory<roundTripString_rtripconversions_Test>::
~ParameterizedTestFactory(ParameterizedTestFactory<roundTripString_rtripconversions_Test> *this)

{
  ParameterizedTestFactory<roundTripString_rtripconversions_Test> *this_local;
  
  (this->super_TestFactoryBase)._vptr_TestFactoryBase =
       (_func_int **)&PTR__ParameterizedTestFactory_00267a60;
  std::__cxx11::string::~string((string *)&this->parameter_);
  TestFactoryBase::~TestFactoryBase(&this->super_TestFactoryBase);
  return;
}

Assistant:

explicit ParameterizedTestFactory(ParamType parameter)
      : parameter_(parameter) {}